

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_pake_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  bool bVar1;
  int iVar2;
  uchar *data;
  size_t len;
  undefined1 local_60 [8];
  CBB pake_share_bytes;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  pake_share_bytes.u._28_4_ = type;
  bVar1 = Array<unsigned_char>::empty(&hs->pake_share_bytes);
  if (bVar1) {
    hs_local._7_1_ = true;
  }
  else {
    iVar2 = CBB_add_u16(out_compressible,0x8a3b);
    if ((iVar2 != 0) &&
       (iVar2 = CBB_add_u16_length_prefixed(out_compressible,(CBB *)local_60), iVar2 != 0)) {
      data = Array<unsigned_char>::data(&hs->pake_share_bytes);
      len = Array<unsigned_char>::size(&hs->pake_share_bytes);
      iVar2 = CBB_add_bytes((CBB *)local_60,data,len);
      if ((iVar2 != 0) && (iVar2 = CBB_flush(out_compressible), iVar2 != 0)) {
        return true;
      }
    }
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_pake_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                     CBB *out_compressible,
                                     ssl_client_hello_type_t type) {
  if (hs->pake_share_bytes.empty()) {
    return true;
  }

  CBB pake_share_bytes;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_pake) ||
      !CBB_add_u16_length_prefixed(out_compressible, &pake_share_bytes) ||
      !CBB_add_bytes(&pake_share_bytes, hs->pake_share_bytes.data(),
                     hs->pake_share_bytes.size()) ||
      !CBB_flush(out_compressible)) {
    return false;
  }

  return true;
}